

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.h
# Opt level: O2

void __thiscall Assimp::LWOImporter::GetS0(LWOImporter *this,string *out,uint max)

{
  uint8_t *puVar1;
  Logger *this_00;
  uint uVar2;
  uint8_t *puVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = this->mFileBuffer;
  uVar2 = 1;
  puVar3 = puVar1;
  do {
    if (*puVar3 == '\0') {
LAB_004079d2:
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,puVar1);
      std::__cxx11::string::operator=((string *)out,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar3 - (int)puVar1 & 1));
      return;
    }
    if (max < uVar2) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"LWO: Invalid file, string is is too long");
      puVar3 = this->mFileBuffer;
      goto LAB_004079d2;
    }
    puVar3 = puVar3 + 1;
    this->mFileBuffer = puVar3;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

inline void LWOImporter::GetS0(std::string& out,unsigned int max)
{
    unsigned int iCursor = 0;
    const char*sz = (const char*)mFileBuffer;
    while (*mFileBuffer)
    {
        if (++iCursor > max)
        {
            ASSIMP_LOG_WARN("LWO: Invalid file, string is is too long");
            break;
        }
        ++mFileBuffer;
    }
    size_t len = (size_t) ((const char*)mFileBuffer-sz);
    out = std::string(sz,len);
    mFileBuffer += (len&0x1 ? 1 : 2);
}